

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O1

void __thiscall
slang::parsing::Preprocessor::handleProtectEncoding
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_3)

{
  SyntaxNode *pSVar1;
  int iVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  size_t sVar4;
  Diagnostic *pDVar5;
  optional<unsigned_int> oVar6;
  char *__s1;
  byte *pbVar7;
  ulong uVar8;
  size_type __rlen;
  long lVar9;
  undefined1 auVar10 [16];
  string_view sVar11;
  SourceRange SVar12;
  string_view arg;
  string valueText;
  Token value;
  Token local_78;
  string local_68;
  PragmaExpressionSyntax *local_48;
  Token local_40;
  
  local_78.info = keyword.info;
  local_78._0_8_ = keyword._0_8_;
  if (args == (PragmaExpressionSyntax *)0x0) {
    SVar12 = Token::range(&local_78);
  }
  else {
    if (((args->super_SyntaxNode).kind == ParenPragmaExpression) &&
       (pSVar1 = args[3].super_SyntaxNode.previewNode, pSVar1 != (SyntaxNode *)0x0)) {
      this->protectLineLength = 0;
      this->protectBytes = 0;
      pbVar7 = (byte *)((long)&pSVar1->kind + 1);
      if (pbVar7 < (byte *)0x2) {
        return;
      }
      uVar8 = (ulong)pbVar7 >> 1;
      lVar9 = 0;
      local_48 = args;
      do {
        ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(local_48[3].super_SyntaxNode.parent)->kind + lVar9));
        pSVar1 = *ppSVar3;
        if (pSVar1->kind == NameValuePragmaExpression) {
          sVar11 = Token::valueText((Token *)(pSVar1 + 1));
          __s1 = sVar11._M_str;
          sVar4 = sVar11._M_len;
          if ((long)sVar4 < 7) {
LAB_002129a8:
            if (sVar4 != 0) {
              if ((sVar4 != 5) || (iVar2 = bcmp(__s1,"bytes",5), iVar2 != 0)) {
LAB_002129d6:
                SVar12 = Token::range((Token *)(pSVar1 + 1));
                pDVar5 = addDiag(this,(DiagCode)0x2e0004,SVar12);
                arg = Token::valueText(&local_78);
                pDVar5 = Diagnostic::operator<<(pDVar5,arg);
                goto LAB_00212a46;
              }
              oVar6 = requireUInt32(this,(PragmaExpressionSyntax *)pSVar1[2].parent);
              if (((ulong)oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
                this->protectBytes =
                     oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int>._M_payload;
              }
            }
          }
          else if (sVar4 == 0xb) {
            iVar2 = bcmp(__s1,"line_length",0xb);
            if (iVar2 != 0) goto LAB_002129a8;
            oVar6 = requireUInt32(this,(PragmaExpressionSyntax *)pSVar1[2].parent);
            if (((ulong)oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
              this->protectLineLength =
                   oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>._M_payload;
            }
          }
          else {
            if ((sVar4 != 7) || (iVar2 = bcmp(__s1,"enctype",7), iVar2 != 0)) goto LAB_002129d6;
            local_40 = syntax::SyntaxNode::getFirstToken(pSVar1[2].parent);
            sVar11 = Token::valueText(&local_40);
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_68,sVar11._M_str,sVar11._M_str + sVar11._M_len);
            strToLower(&local_68);
            if ((long)local_68._M_string_length < 8) {
              if (local_68._M_string_length == 3) {
                if ((char)*(short *)(local_68._M_dataplus._M_p + 2) != 'w' ||
                    *(short *)local_68._M_dataplus._M_p != 0x6172) goto LAB_00212bad;
                this->protectEncoding = Raw;
              }
              else {
LAB_00212b18:
                if ((local_68._M_string_length == 6) &&
                   ((short)*(int *)(local_68._M_dataplus._M_p + 4) == 0x3436 &&
                    *(int *)local_68._M_dataplus._M_p == 0x65736162)) {
                  this->protectEncoding = Base64;
                }
                else {
LAB_00212bad:
                  this->protectEncoding = Raw;
                  SVar12 = Token::range(&local_40);
                  pDVar5 = addDiag(this,(DiagCode)0x2c0004,SVar12);
                  sVar11 = Token::valueText(&local_40);
                  Diagnostic::operator<<(pDVar5,sVar11);
                }
              }
            }
            else if (local_68._M_string_length == 0x10) {
              auVar10[0] = -(*local_68._M_dataplus._M_p == 'q');
              auVar10[1] = -(local_68._M_dataplus._M_p[1] == 'u');
              auVar10[2] = -((char)*(short *)(local_68._M_dataplus._M_p + 2) == 'o');
              auVar10[3] = -(local_68._M_dataplus._M_p[3] == 't');
              auVar10[4] = -((char)*(int *)(local_68._M_dataplus._M_p + 4) == 'e');
              auVar10[5] = -(local_68._M_dataplus._M_p[5] == 'd');
              auVar10[6] = -((char)*(short *)(local_68._M_dataplus._M_p + 6) == '-');
              auVar10[7] = -(local_68._M_dataplus._M_p[7] == 'p');
              auVar10[8] = -((char)*(long *)(local_68._M_dataplus._M_p + 8) == 'r');
              auVar10[9] = -(local_68._M_dataplus._M_p[9] == 'i');
              auVar10[10] = -((char)*(short *)(local_68._M_dataplus._M_p + 10) == 'n');
              auVar10[0xb] = -(local_68._M_dataplus._M_p[0xb] == 't');
              auVar10[0xc] = -((char)*(int *)(local_68._M_dataplus._M_p + 0xc) == 'a');
              auVar10[0xd] = -(local_68._M_dataplus._M_p[0xd] == 'b');
              auVar10[0xe] = -((char)*(short *)(local_68._M_dataplus._M_p + 0xe) == 'l');
              auVar10[0xf] = -(local_68._M_dataplus._M_p[0xf] == 'e');
              if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar10[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00212bad;
              this->protectEncoding = QuotedPrintable;
            }
            else {
              if (local_68._M_string_length != 8) goto LAB_00212bad;
              if (*(size_type *)local_68._M_dataplus._M_p != 0x65646f636e657575) goto LAB_00212b18;
              this->protectEncoding = UUEncode;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else {
          SVar12 = syntax::SyntaxNode::sourceRange(pSVar1);
          pDVar5 = addDiag(this,(DiagCode)0x270004,SVar12);
          sVar11 = Token::valueText(&local_78);
LAB_00212a46:
          Diagnostic::operator<<(pDVar5,sVar11);
        }
        lVar9 = lVar9 + 0x30;
        uVar8 = uVar8 - 1;
        if (uVar8 == 0) {
          return;
        }
      } while( true );
    }
    SVar12 = syntax::SyntaxNode::sourceRange(&args->super_SyntaxNode);
  }
  pDVar5 = addDiag(this,(DiagCode)0x270004,SVar12);
  sVar11 = Token::valueText(&local_78);
  Diagnostic::operator<<(pDVar5,sVar11);
  return;
}

Assistant:

void Preprocessor::handleProtectEncoding(Token keyword, const PragmaExpressionSyntax* args,
                                         SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.empty()) {
        addDiag(diag::ProtectArgList, args ? args->sourceRange() : keyword.range())
            << keyword.valueText();
        return;
    }

    protectLineLength = 0;
    protectBytes = 0;

    for (auto arg : args->as<ParenPragmaExpressionSyntax>().values) {
        if (arg->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::ProtectArgList, arg->sourceRange()) << keyword.valueText();
            continue;
        }

        auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
        auto name = nvp.name.valueText();
        if (name == "enctype"sv) {
            auto value = nvp.value->getFirstToken();

            std::string valueText(value.valueText());
            strToLower(valueText);

            if (valueText == "uuencode"sv) {
                protectEncoding = ProtectEncoding::UUEncode;
            }
            else if (valueText == "base64"sv) {
                protectEncoding = ProtectEncoding::Base64;
            }
            else if (valueText == "quoted-printable"sv) {
                protectEncoding = ProtectEncoding::QuotedPrintable;
            }
            else if (valueText == "raw"sv) {
                protectEncoding = ProtectEncoding::Raw;
            }
            else {
                protectEncoding = ProtectEncoding::Raw;
                addDiag(diag::UnknownProtectEncoding, value.range()) << value.valueText();
            }
        }
        else if (name == "line_length"sv) {
            if (auto num = requireUInt32(*nvp.value))
                protectLineLength = *num;
        }
        else if (name == "bytes"sv) {
            if (auto num = requireUInt32(*nvp.value))
                protectBytes = *num;
        }
        else if (!name.empty()) {
            addDiag(diag::UnknownProtectOption, nvp.name.range()) << keyword.valueText() << name;
        }
    }
}